

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>
duckdb::BitpackingInitAnalyze<unsigned_int>(ColumnData *col_data,PhysicalType type)

{
  BitpackingMode BVar1;
  DatabaseInstance *db;
  BlockManager *block_manager;
  pointer pBVar2;
  ColumnData *in_RSI;
  unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_> in_RDI;
  templated_unique_single_t state;
  CompressionInfo info;
  DBConfig *config;
  unique_ptr<duckdb::BitpackingAnalyzeState<unsigned_int>,_std::default_delete<duckdb::BitpackingAnalyzeState<unsigned_int>_>_>
  *in_stack_ffffffffffffff88;
  _Head_base<0UL,_duckdb::AnalyzeState_*,_false> this;
  CompressionInfo local_30;
  CompressionInfo local_28;
  DBConfig *local_20;
  ColumnData *local_10;
  
  this._M_head_impl =
       (AnalyzeState *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::AnalyzeState_*,_std::default_delete<duckdb::AnalyzeState>_>.
       super__Head_base<0UL,_duckdb::AnalyzeState_*,_false>._M_head_impl;
  local_10 = in_RSI;
  db = ColumnData::GetDatabase((ColumnData *)0xa914ab);
  local_20 = DBConfig::GetConfig(db);
  block_manager = ColumnData::GetBlockManager(local_10);
  CompressionInfo::CompressionInfo(&local_28,block_manager);
  make_uniq<duckdb::BitpackingAnalyzeState<unsigned_int>,duckdb::CompressionInfo&>(&local_30);
  BVar1 = (local_20->options).force_bitpacking_mode;
  pBVar2 = unique_ptr<duckdb::BitpackingAnalyzeState<unsigned_int>,_std::default_delete<duckdb::BitpackingAnalyzeState<unsigned_int>_>,_true>
           ::operator->((unique_ptr<duckdb::BitpackingAnalyzeState<unsigned_int>,_std::default_delete<duckdb::BitpackingAnalyzeState<unsigned_int>_>,_true>
                         *)this._M_head_impl);
  (pBVar2->state).mode = BVar1;
  unique_ptr<duckdb::AnalyzeState,std::default_delete<duckdb::AnalyzeState>,true>::
  unique_ptr<duckdb::BitpackingAnalyzeState<unsigned_int>,std::default_delete<duckdb::unique_ptr<duckdb::AnalyzeState,std::default_delete<duckdb::AnalyzeState>,true>::unique_ptr>,void>
            ((unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true> *)
             this._M_head_impl,in_stack_ffffffffffffff88);
  unique_ptr<duckdb::BitpackingAnalyzeState<unsigned_int>,_std::default_delete<duckdb::BitpackingAnalyzeState<unsigned_int>_>,_true>
  ::~unique_ptr((unique_ptr<duckdb::BitpackingAnalyzeState<unsigned_int>,_std::default_delete<duckdb::BitpackingAnalyzeState<unsigned_int>_>,_true>
                 *)0xa91530);
  return (unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>)
         (__uniq_ptr_impl<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::AnalyzeState_*,_std::default_delete<duckdb::AnalyzeState>_>.
         super__Head_base<0UL,_duckdb::AnalyzeState_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<AnalyzeState> BitpackingInitAnalyze(ColumnData &col_data, PhysicalType type) {
	auto &config = DBConfig::GetConfig(col_data.GetDatabase());

	CompressionInfo info(col_data.GetBlockManager());
	auto state = make_uniq<BitpackingAnalyzeState<T>>(info);
	state->state.mode = config.options.force_bitpacking_mode;

	return std::move(state);
}